

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_trng::optimized_impl::uint128_&,_const_trng::optimized_impl::uint128_&> *
__thiscall
Catch::ExprLhs<trng::optimized_impl::uint128_const&>::operator<=
          (ExprLhs<const_trng::optimized_impl::uint128_&> *this,uint128 *rhs)

{
  uint128 a;
  uint128 b;
  StringRef op;
  bool comparisonResult;
  uint128 *in_RSI;
  BinaryExpr<const_trng::optimized_impl::uint128_&,_const_trng::optimized_impl::uint128_&> *in_RDI;
  uint128 *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  char *pcVar1;
  BinaryExpr<const_trng::optimized_impl::uint128_&,_const_trng::optimized_impl::uint128_&> *pBVar2;
  
  a.value._8_8_ = in_RSI;
  a.value._0_8_ = in_stack_ffffffffffffff88;
  b.value._7_1_ = in_stack_ffffffffffffff9f;
  b.value._0_7_ = in_stack_ffffffffffffff98;
  b.value._8_8_ = in_RDI;
  pBVar2 = in_RDI;
  comparisonResult = trng::optimized_impl::operator<=(a,b);
  pcVar1 = *(char **)&in_RSI->value;
  StringRef::StringRef
            ((StringRef *)in_RDI,(char *)CONCAT17(comparisonResult,in_stack_ffffffffffffff98));
  op.m_size = (size_type)pBVar2;
  op.m_start = pcVar1;
  BinaryExpr<const_trng::optimized_impl::uint128_&,_const_trng::optimized_impl::uint128_&>::
  BinaryExpr(in_RDI,comparisonResult,in_RSI,op,in_stack_ffffffffffffff88);
  return pBVar2;
}

Assistant:

auto operator <= ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { static_cast<bool>(m_lhs <= rhs), m_lhs, "<=", rhs };
        }